

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * __thiscall
vkt::shaderexecutor::
Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *this,EvalContext *ctx)

{
  Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Expr<tcu::Vector<float,_3>_> *pEVar1;
  Expr<vkt::shaderexecutor::Void> *pEVar2;
  IArg3 local_b3 [2];
  IArg2 local_b1;
  IVal local_b0;
  IVal local_68;
  EvalContext *local_20;
  EvalContext *ctx_local;
  Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  this_00 = this->m_func;
  local_20 = ctx;
  ctx_local = (EvalContext *)this;
  this_local = (Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                *)__return_storage_ptr__;
  pEVar1 = de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>::operator->
                     ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_> *)
                      &this->m_args);
  Expr<tcu::Vector<float,_3>_>::evaluate(&local_68,pEVar1,local_20);
  pEVar1 = de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>::operator->
                     ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_> *)
                      &(this->m_args).b);
  Expr<tcu::Vector<float,_3>_>::evaluate(&local_b0,pEVar1,local_20);
  pEVar2 = de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::operator->
                     ((SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)
                      &(this->m_args).c);
  Expr<vkt::shaderexecutor::Void>::evaluate(pEVar2,local_20);
  pEVar2 = de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::operator->
                     ((SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)
                      &(this->m_args).d);
  Expr<vkt::shaderexecutor::Void>::evaluate(pEVar2,local_20);
  Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::apply(__return_storage_ptr__,this_00,ctx,&local_68,&local_b0,&local_b1,local_b3);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		return m_func.apply(ctx,
							m_args.a->evaluate(ctx), m_args.b->evaluate(ctx),
							m_args.c->evaluate(ctx), m_args.d->evaluate(ctx));
	}